

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

QString * __thiscall
QPlainTextEdit::anchorAt(QString *__return_storage_ptr__,QPlainTextEdit *this,QPoint *pos)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *pQVar1;
  long lVar2;
  undefined1 auVar3 [16];
  double dVar4;
  qreal qVar5;
  double dVar6;
  int iVar7;
  QTextDocument *pQVar8;
  long in_FS_OFFSET;
  double dStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  long *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pQVar1 = this_00->control;
  dVar4 = (double)(*pos).xp.m_i;
  dVar6 = (double)(*pos).yp.m_i;
  auVar3._8_4_ = SUB84(dVar6,0);
  auVar3._0_8_ = dVar4;
  auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
  iVar7 = QPlainTextEditPrivate::horizontalOffset(this_00);
  qVar5 = QPlainTextEditPrivate::verticalOffset(this_00);
  local_48 = (long *)((double)iVar7 + dVar4);
  dStack_60 = auVar3._8_8_;
  puStack_40 = (undefined1 *)(qVar5 + dStack_60);
  iVar7 = (**(code **)(*(long *)&pQVar1->super_QWidgetTextControl + 0x78))(pQVar1,&local_48,0);
  if (iVar7 < 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pQVar8 = document(this);
    lVar2 = *(long *)(pQVar8 + 8);
    local_48 = (long *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocumentPrivate::find((QTextDocumentPrivate *)&local_48,(int)lVar2);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormatCollection::charFormat
              ((QTextCharFormat *)&local_58,(QTextFormatCollection *)(lVar2 + 0xe8),
               *(int *)(*local_48 + 0x1c + ((ulong)puStack_40 & 0xffffffff) * 0x20));
    QTextCharFormat::anchorHref(__return_storage_ptr__,(QTextCharFormat *)&local_58);
    QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QPlainTextEdit::anchorAt(const QPoint &pos) const
{
    Q_D(const QPlainTextEdit);
    int cursorPos = d->control->hitTest(pos + QPointF(d->horizontalOffset(),
                                                     d->verticalOffset()),
                                        Qt::ExactHit);
    if (cursorPos < 0)
        return QString();

    QTextDocumentPrivate *pieceTable = QTextDocumentPrivate::get(document());
    QTextDocumentPrivate::FragmentIterator it = pieceTable->find(cursorPos);
    QTextCharFormat fmt = pieceTable->formatCollection()->charFormat(it->format);
    return fmt.anchorHref();
}